

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

void xmlTextWriterStartDocumentCallback(void *ctx)

{
  htmlDocPtr pxVar1;
  xmlChar *pxVar2;
  xmlDocPtr local_20;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  void *ctx_local;
  
  if (*(int *)((long)ctx + 0x34) == 0) {
    local_20 = *(xmlDocPtr *)((long)ctx + 0x10);
    if (local_20 == (xmlDocPtr)0x0) {
      local_20 = xmlNewDoc(*(xmlChar **)((long)ctx + 0x20));
      *(xmlDocPtr *)((long)ctx + 0x10) = local_20;
    }
    if (local_20 == (xmlDocPtr)0x0) {
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      return;
    }
    if (local_20->children == (_xmlNode *)0x0) {
      if (*(long *)((long)ctx + 0x28) == 0) {
        local_20->encoding = (xmlChar *)0x0;
      }
      else {
        pxVar2 = xmlStrdup(*(xmlChar **)((long)ctx + 0x28));
        local_20->encoding = pxVar2;
      }
      local_20->standalone = *(int *)((long)ctx + 0x30);
    }
  }
  else {
    if (*(long *)((long)ctx + 0x10) == 0) {
      pxVar1 = htmlNewDocNoDtD((xmlChar *)0x0,(xmlChar *)0x0);
      *(htmlDocPtr *)((long)ctx + 0x10) = pxVar1;
    }
    if (*(long *)((long)ctx + 0x10) == 0) {
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      return;
    }
  }
  if ((((*(long *)((long)ctx + 0x10) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x88) == 0))
      && (*(long *)((long)ctx + 0x38) != 0)) && (*(long *)(*(long *)((long)ctx + 0x38) + 8) != 0)) {
    pxVar2 = xmlCanonicPath(*(xmlChar **)(*(long *)((long)ctx + 0x38) + 8));
    *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar2;
    if (*(long *)(*(long *)((long)ctx + 0x10) + 0x88) == 0) {
      pxVar2 = xmlStrdup(*(xmlChar **)(*(long *)((long)ctx + 0x38) + 8));
      *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar2;
    }
  }
  return;
}

Assistant:

static void
xmlTextWriterStartDocumentCallback(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlDocPtr doc;

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        if (ctxt->myDoc == NULL)
            ctxt->myDoc = htmlNewDocNoDtD(NULL, NULL);
        if (ctxt->myDoc == NULL) {
            xmlCtxtErrMemory(ctxt);
            return;
        }
    } else
#endif
    {
        doc = ctxt->myDoc;
        if (doc == NULL)
            doc = ctxt->myDoc = xmlNewDoc(ctxt->version);
        if (doc != NULL) {
            if (doc->children == NULL) {
                if (ctxt->encoding != NULL)
                    doc->encoding = xmlStrdup(ctxt->encoding);
                else
                    doc->encoding = NULL;
                doc->standalone = ctxt->standalone;
            }
        } else {
            xmlCtxtErrMemory(ctxt);
            return;
        }
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->URL == NULL) &&
        (ctxt->input != NULL) && (ctxt->input->filename != NULL)) {
        ctxt->myDoc->URL =
            xmlCanonicPath((const xmlChar *) ctxt->input->filename);
        if (ctxt->myDoc->URL == NULL)
            ctxt->myDoc->URL =
                xmlStrdup((const xmlChar *) ctxt->input->filename);
    }
}